

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O0

void __thiscall
boost::function1<void,_boost::unit_test::basic_cstring<const_char>_>::swap
          (function1<void,_boost::unit_test::basic_cstring<const_char>_> *this,
          function1<void,_boost::unit_test::basic_cstring<const_char>_> *other)

{
  long in_RSI;
  long in_RDI;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> tmp;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> *in_stack_ffffffffffffffc8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> *in_stack_ffffffffffffffd0;
  
  if (in_RSI != in_RDI) {
    function1((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)0x268270);
    move_assign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    move_assign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    move_assign(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    ~function1((function1<void,_boost::unit_test::basic_cstring<const_char>_> *)0x2682ad);
  }
  return;
}

Assistant:

void swap(BOOST_FUNCTION_FUNCTION& other)
    {
      if (&other == this)
        return;

      BOOST_FUNCTION_FUNCTION tmp;
      tmp.move_assign(*this);
      this->move_assign(other);
      other.move_assign(tmp);
    }